

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O1

function<void_()> * __thiscall
Console::bindCallback<std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  function<void_()> nextCallback;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  _Any_data local_78;
  code *local_68;
  _Any_data local_58;
  code *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  lVar1 = *(long *)&(callback->super__Function_base)._M_functor;
  if ((ulong)(long)(int)arguments <
      (ulong)(*(long *)((long)&(callback->super__Function_base)._M_functor + 8) - lVar1 >> 5)) {
    lVar4 = (long)(int)arguments * 0x20;
    lVar2 = *(long *)(lVar1 + lVar4);
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,lVar2,*(long *)(lVar1 + 8 + lVar4) + lVar2);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)&local_58,
               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)this);
    local_38[0] = &local_28;
    std::__cxx11::string::_M_construct<char*>((string *)local_38,local_b8,local_b0 + (long)local_b8)
    ;
    std::function<void()>::
    function<Console::bindCallback<std::__cxx11::string>(std::function<void(std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda()_1_,void>
              ((function<void()> *)local_78._M_pod_data,(anon_class_64_2_4fe94ccd *)&local_58);
    if (local_38[0] != &local_28) {
      operator_delete(local_38[0],local_28._M_allocated_capacity + 1);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    std::function<void_()>::function((function<void_()> *)&local_98,(function<void_()> *)&local_78);
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = p_Stack_80;
    if (local_88 != (_Manager_type)0x0) {
      *(void **)&(__return_storage_ptr__->super__Function_base)._M_functor =
           local_98._M_unused._M_object;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) =
           local_98._8_8_;
      (__return_storage_ptr__->super__Function_base)._M_manager = local_88;
      local_88 = (_Manager_type)0x0;
      p_Stack_80 = (_Invoker_type)0x0;
    }
    if (local_88 != (_Manager_type)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  __clang_call_terminate(uVar3);
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}